

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<8,_1048576,_false,_embree::avx::ArrayIntersector1<embree::avx::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  long lVar1;
  long lVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  float **ppfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  Geometry *pGVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  BaseNode_conflict *node;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  long lVar61;
  uint uVar62;
  ulong *puVar63;
  ulong uVar64;
  Scene *pSVar65;
  ulong uVar66;
  RTCIntersectArguments *pRVar67;
  ulong uVar68;
  ulong uVar69;
  ulong uVar70;
  ulong uVar71;
  float fVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [16];
  float fVar82;
  float fVar83;
  float fVar84;
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  float fVar81;
  float fVar85;
  undefined1 auVar80 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar93;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  float fVar94;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  float fVar95;
  float fVar100;
  float fVar101;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  undefined1 auVar99 [32];
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar114;
  float fVar117;
  float fVar119;
  undefined1 auVar109 [16];
  float fVar121;
  float fVar122;
  float fVar123;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  float fVar115;
  float fVar116;
  float fVar118;
  float fVar120;
  undefined1 auVar113 [32];
  float fVar124;
  float fVar132;
  float fVar133;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  float fVar138;
  float fVar144;
  float fVar145;
  undefined1 auVar139 [16];
  float fVar147;
  float fVar148;
  float fVar149;
  undefined1 auVar140 [32];
  float fVar146;
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  float fVar155;
  float fVar156;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  float fVar174;
  float fVar180;
  float fVar181;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  float fVar183;
  float fVar184;
  float fVar185;
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  float fVar182;
  float fVar186;
  undefined1 auVar179 [32];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  float fVar189;
  undefined1 auVar190 [32];
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  undefined1 auVar191 [64];
  float fVar198;
  undefined1 auVar199 [32];
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  undefined1 auVar200 [64];
  undefined1 auVar207 [32];
  undefined1 auVar208 [64];
  float fVar209;
  undefined1 auVar210 [32];
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  undefined1 auVar211 [64];
  float fVar218;
  float fVar219;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  undefined1 auVar220 [64];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  int local_1794;
  ulong *local_1790;
  Scene *local_1788;
  undefined8 local_1780;
  float fStack_1778;
  float fStack_1774;
  float fStack_1770;
  float fStack_176c;
  float fStack_1768;
  float fStack_1764;
  long local_1750;
  long local_1748;
  undefined1 local_1740 [32];
  undefined4 local_1720;
  undefined4 local_171c;
  undefined4 local_1718;
  undefined4 local_1714;
  undefined4 local_1710;
  undefined4 local_170c;
  uint local_1708;
  uint local_1704;
  uint local_1700;
  RTCFilterFunctionNArguments local_16f0;
  undefined1 local_16c0 [32];
  undefined1 local_16a0 [32];
  undefined1 local_1680 [32];
  undefined1 local_1660 [32];
  undefined1 local_1640 [32];
  float local_1620;
  float fStack_161c;
  float fStack_1618;
  float fStack_1614;
  float fStack_1610;
  float fStack_160c;
  float fStack_1608;
  float fStack_1604;
  undefined1 local_1600 [32];
  undefined1 local_15e0 [32];
  undefined1 local_15c0 [32];
  undefined1 local_15a0 [32];
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float fStack_13a4;
  float local_13a0;
  float fStack_139c;
  float fStack_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float fStack_1388;
  float fStack_1384;
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  ulong local_1200 [570];
  
  local_1200[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_1200[0] != 8) {
    fVar107 = ray->tfar;
    if (0.0 <= fVar107) {
      local_1790 = local_1200 + 1;
      aVar4 = (ray->dir).field_0;
      auVar73 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar74._8_4_ = 0x7fffffff;
      auVar74._0_8_ = 0x7fffffff7fffffff;
      auVar74._12_4_ = 0x7fffffff;
      auVar74 = vandps_avx((undefined1  [16])aVar4,auVar74);
      auVar125._8_4_ = 0x219392ef;
      auVar125._0_8_ = 0x219392ef219392ef;
      auVar125._12_4_ = 0x219392ef;
      auVar74 = vcmpps_avx(auVar74,auVar125,1);
      auVar74 = vblendvps_avx((undefined1  [16])aVar4,auVar125,auVar74);
      auVar125 = vrcpps_avx(auVar74);
      fVar106 = auVar125._0_4_;
      auVar96._0_4_ = fVar106 * auVar74._0_4_;
      fVar114 = auVar125._4_4_;
      auVar96._4_4_ = fVar114 * auVar74._4_4_;
      fVar117 = auVar125._8_4_;
      auVar96._8_4_ = fVar117 * auVar74._8_4_;
      fVar119 = auVar125._12_4_;
      auVar96._12_4_ = fVar119 * auVar74._12_4_;
      auVar126._8_4_ = 0x3f800000;
      auVar126._0_8_ = 0x3f8000003f800000;
      auVar126._12_4_ = 0x3f800000;
      auVar74 = vsubps_avx(auVar126,auVar96);
      uVar3 = *(undefined4 *)&(ray->org).field_0;
      local_1580._4_4_ = uVar3;
      local_1580._0_4_ = uVar3;
      local_1580._8_4_ = uVar3;
      local_1580._12_4_ = uVar3;
      local_1580._16_4_ = uVar3;
      local_1580._20_4_ = uVar3;
      local_1580._24_4_ = uVar3;
      local_1580._28_4_ = uVar3;
      auVar191 = ZEXT3264(local_1580);
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_15a0._4_4_ = uVar3;
      local_15a0._0_4_ = uVar3;
      local_15a0._8_4_ = uVar3;
      local_15a0._12_4_ = uVar3;
      local_15a0._16_4_ = uVar3;
      local_15a0._20_4_ = uVar3;
      local_15a0._24_4_ = uVar3;
      local_15a0._28_4_ = uVar3;
      auVar200 = ZEXT3264(local_15a0);
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_15c0._4_4_ = uVar3;
      local_15c0._0_4_ = uVar3;
      local_15c0._8_4_ = uVar3;
      local_15c0._12_4_ = uVar3;
      local_15c0._16_4_ = uVar3;
      local_15c0._20_4_ = uVar3;
      local_15c0._24_4_ = uVar3;
      local_15c0._28_4_ = uVar3;
      auVar208 = ZEXT3264(local_15c0);
      auVar97._0_4_ = fVar106 + fVar106 * auVar74._0_4_;
      auVar97._4_4_ = fVar114 + fVar114 * auVar74._4_4_;
      auVar97._8_4_ = fVar117 + fVar117 * auVar74._8_4_;
      auVar97._12_4_ = fVar119 + fVar119 * auVar74._12_4_;
      auVar74 = vshufps_avx(auVar97,auVar97,0);
      local_15e0._16_16_ = auVar74;
      local_15e0._0_16_ = auVar74;
      auVar211 = ZEXT3264(local_15e0);
      auVar74 = vmovshdup_avx(auVar97);
      auVar125 = vshufps_avx(auVar97,auVar97,0x55);
      local_1600._16_16_ = auVar125;
      local_1600._0_16_ = auVar125;
      auVar220 = ZEXT3264(local_1600);
      auVar125 = vshufpd_avx(auVar97,auVar97,1);
      auVar96 = vshufps_avx(auVar97,auVar97,0xaa);
      uVar68 = (ulong)(auVar97._0_4_ < 0.0) << 3;
      local_1420._16_16_ = auVar96;
      local_1420._0_16_ = auVar96;
      uVar58 = (ulong)(auVar74._0_4_ < 0.0);
      lVar1 = uVar58 * 8;
      uVar59 = (ulong)(auVar125._0_4_ < 0.0);
      lVar2 = uVar59 * 8;
      auVar74 = vshufps_avx(auVar73,auVar73,0);
      local_1440._16_16_ = auVar74;
      local_1440._0_16_ = auVar74;
      auVar74 = vshufps_avx(ZEXT416((uint)fVar107),ZEXT416((uint)fVar107),0);
      local_1460._16_16_ = auVar74;
      local_1460._0_16_ = auVar74;
      uVar69 = uVar68 ^ 8;
      uVar71 = lVar1 + 0x10U ^ 8;
      uVar70 = lVar2 + 0x20U ^ 8;
      local_1560._0_16_ = mm_lookupmask_ps._0_16_;
      local_1560._16_16_ = mm_lookupmask_ps._240_16_;
LAB_00e77965:
      if (local_1790 != local_1200) {
        uVar66 = local_1790[-1];
        local_1790 = local_1790 + -1;
        while ((uVar66 & 8) == 0) {
          uVar60 = uVar66 & 0xfffffffffffffff0;
          puVar63 = (ulong *)(uVar60 + 0x40);
          if (uVar60 == 0) {
            puVar63 = (ulong *)0x0;
          }
          auVar73._8_8_ = 0;
          auVar73._0_8_ = *puVar63;
          auVar86._8_8_ = 0;
          auVar86._0_8_ = puVar63[1];
          auVar74 = vpminub_avx(auVar73,auVar86);
          auVar74 = vpcmpeqb_avx(auVar73,auVar74);
          auVar76._8_8_ = 0;
          auVar76._0_8_ = *(ulong *)((long)puVar63 + 4);
          auVar98._8_8_ = 0;
          auVar98._0_8_ = *(ulong *)((long)puVar63 + 0xc);
          auVar73 = vpminub_avx(auVar76,auVar98);
          fVar107 = *(float *)(puVar63 + 6);
          auVar73 = vpcmpeqb_avx(auVar76,auVar73);
          fVar106 = *(float *)((long)puVar63 + 0x3c);
          auVar87._8_8_ = 0;
          auVar87._0_8_ = *(ulong *)((long)puVar63 + uVar68);
          auVar125 = vpmovzxbd_avx(auVar87);
          auVar127._8_8_ = 0;
          auVar127._0_8_ = *(ulong *)((long)puVar63 + uVar68 + 4);
          auVar96 = vpmovzxbd_avx(auVar127);
          auVar88._16_16_ = auVar96;
          auVar88._0_16_ = auVar125;
          auVar88 = vcvtdq2ps_avx(auVar88);
          auVar89._0_4_ = fVar107 + fVar106 * auVar88._0_4_;
          auVar89._4_4_ = fVar107 + fVar106 * auVar88._4_4_;
          auVar89._8_4_ = fVar107 + fVar106 * auVar88._8_4_;
          auVar89._12_4_ = fVar107 + fVar106 * auVar88._12_4_;
          auVar89._16_4_ = fVar107 + fVar106 * auVar88._16_4_;
          auVar89._20_4_ = fVar107 + fVar106 * auVar88._20_4_;
          auVar89._24_4_ = fVar107 + fVar106 * auVar88._24_4_;
          auVar89._28_4_ = fVar107 + auVar88._28_4_;
          auVar128._8_8_ = 0;
          auVar128._0_8_ = *(ulong *)((long)puVar63 + uVar69);
          auVar125 = vpmovzxbd_avx(auVar128);
          auVar139._8_8_ = 0;
          auVar139._0_8_ = *(ulong *)((long)puVar63 + uVar69 + 4);
          auVar96 = vpmovzxbd_avx(auVar139);
          auVar129._16_16_ = auVar96;
          auVar129._0_16_ = auVar125;
          auVar88 = vcvtdq2ps_avx(auVar129);
          fVar114 = *(float *)((long)puVar63 + 0x34);
          auVar99._0_4_ = fVar107 + fVar106 * auVar88._0_4_;
          auVar99._4_4_ = fVar107 + fVar106 * auVar88._4_4_;
          auVar99._8_4_ = fVar107 + fVar106 * auVar88._8_4_;
          auVar99._12_4_ = fVar107 + fVar106 * auVar88._12_4_;
          auVar99._16_4_ = fVar107 + fVar106 * auVar88._16_4_;
          auVar99._20_4_ = fVar107 + fVar106 * auVar88._20_4_;
          auVar99._24_4_ = fVar107 + fVar106 * auVar88._24_4_;
          auVar99._28_4_ = fVar107 + fVar106;
          fVar107 = *(float *)(puVar63 + 8);
          auVar109._8_8_ = 0;
          auVar109._0_8_ = puVar63[uVar58 + 2];
          auVar125 = vpmovzxbd_avx(auVar109);
          auVar150._8_8_ = 0;
          auVar150._0_8_ = *(ulong *)((long)puVar63 + lVar1 + 0x14);
          auVar96 = vpmovzxbd_avx(auVar150);
          auVar110._16_16_ = auVar96;
          auVar110._0_16_ = auVar125;
          auVar88 = vcvtdq2ps_avx(auVar110);
          auVar111._0_4_ = fVar114 + fVar107 * auVar88._0_4_;
          auVar111._4_4_ = fVar114 + fVar107 * auVar88._4_4_;
          auVar111._8_4_ = fVar114 + fVar107 * auVar88._8_4_;
          auVar111._12_4_ = fVar114 + fVar107 * auVar88._12_4_;
          auVar111._16_4_ = fVar114 + fVar107 * auVar88._16_4_;
          auVar111._20_4_ = fVar114 + fVar107 * auVar88._20_4_;
          auVar111._24_4_ = fVar114 + fVar107 * auVar88._24_4_;
          auVar111._28_4_ = fVar114 + auVar88._28_4_;
          auVar151._8_8_ = 0;
          auVar151._0_8_ = *(ulong *)((long)puVar63 + uVar71);
          auVar125 = vpmovzxbd_avx(auVar151);
          auVar157._8_8_ = 0;
          auVar157._0_8_ = *(ulong *)((long)puVar63 + uVar71 + 4);
          auVar96 = vpmovzxbd_avx(auVar157);
          auVar152._16_16_ = auVar96;
          auVar152._0_16_ = auVar125;
          auVar88 = vcvtdq2ps_avx(auVar152);
          fVar106 = *(float *)(puVar63 + 7);
          auVar130._0_4_ = fVar114 + fVar107 * auVar88._0_4_;
          auVar130._4_4_ = fVar114 + fVar107 * auVar88._4_4_;
          auVar130._8_4_ = fVar114 + fVar107 * auVar88._8_4_;
          auVar130._12_4_ = fVar114 + fVar107 * auVar88._12_4_;
          auVar130._16_4_ = fVar114 + fVar107 * auVar88._16_4_;
          auVar130._20_4_ = fVar114 + fVar107 * auVar88._20_4_;
          auVar130._24_4_ = fVar114 + fVar107 * auVar88._24_4_;
          auVar130._28_4_ = fVar114 + fVar107;
          fVar107 = *(float *)((long)puVar63 + 0x44);
          auVar158._8_8_ = 0;
          auVar158._0_8_ = puVar63[uVar59 + 4];
          auVar125 = vpmovzxbd_avx(auVar158);
          auVar175._8_8_ = 0;
          auVar175._0_8_ = *(ulong *)((long)puVar63 + lVar2 + 0x24);
          auVar96 = vpmovzxbd_avx(auVar175);
          auVar159._16_16_ = auVar96;
          auVar159._0_16_ = auVar125;
          auVar176._8_8_ = 0;
          auVar176._0_8_ = *(ulong *)((long)puVar63 + uVar70);
          auVar125 = vpmovzxbd_avx(auVar176);
          auVar187._8_8_ = 0;
          auVar187._0_8_ = *(ulong *)((long)puVar63 + uVar70 + 4);
          auVar96 = vpmovzxbd_avx(auVar187);
          auVar177._16_16_ = auVar96;
          auVar177._0_16_ = auVar125;
          auVar88 = vcvtdq2ps_avx(auVar159);
          auVar17 = vcvtdq2ps_avx(auVar177);
          auVar160._0_4_ = auVar88._0_4_ * fVar107 + fVar106;
          auVar160._4_4_ = auVar88._4_4_ * fVar107 + fVar106;
          auVar160._8_4_ = auVar88._8_4_ * fVar107 + fVar106;
          auVar160._12_4_ = auVar88._12_4_ * fVar107 + fVar106;
          auVar160._16_4_ = auVar88._16_4_ * fVar107 + fVar106;
          auVar160._20_4_ = auVar88._20_4_ * fVar107 + fVar106;
          auVar160._24_4_ = auVar88._24_4_ * fVar107 + fVar106;
          auVar160._28_4_ = auVar88._28_4_ + fVar106;
          auVar140._0_4_ = fVar106 + auVar17._0_4_ * fVar107;
          auVar140._4_4_ = fVar106 + auVar17._4_4_ * fVar107;
          auVar140._8_4_ = fVar106 + auVar17._8_4_ * fVar107;
          auVar140._12_4_ = fVar106 + auVar17._12_4_ * fVar107;
          auVar140._16_4_ = fVar106 + auVar17._16_4_ * fVar107;
          auVar140._20_4_ = fVar106 + auVar17._20_4_ * fVar107;
          auVar140._24_4_ = fVar106 + auVar17._24_4_ * fVar107;
          auVar140._28_4_ = fVar106 + fVar107;
          auVar88 = vsubps_avx(auVar89,auVar191._0_32_);
          auVar17._4_4_ = auVar211._4_4_ * auVar88._4_4_;
          auVar17._0_4_ = auVar211._0_4_ * auVar88._0_4_;
          auVar17._8_4_ = auVar211._8_4_ * auVar88._8_4_;
          auVar17._12_4_ = auVar211._12_4_ * auVar88._12_4_;
          auVar17._16_4_ = auVar211._16_4_ * auVar88._16_4_;
          auVar17._20_4_ = auVar211._20_4_ * auVar88._20_4_;
          auVar17._24_4_ = auVar211._24_4_ * auVar88._24_4_;
          auVar17._28_4_ = auVar88._28_4_;
          auVar88 = vsubps_avx(auVar111,auVar200._0_32_);
          auVar18._4_4_ = auVar220._4_4_ * auVar88._4_4_;
          auVar18._0_4_ = auVar220._0_4_ * auVar88._0_4_;
          auVar18._8_4_ = auVar220._8_4_ * auVar88._8_4_;
          auVar18._12_4_ = auVar220._12_4_ * auVar88._12_4_;
          auVar18._16_4_ = auVar220._16_4_ * auVar88._16_4_;
          auVar18._20_4_ = auVar220._20_4_ * auVar88._20_4_;
          auVar18._24_4_ = auVar220._24_4_ * auVar88._24_4_;
          auVar18._28_4_ = auVar88._28_4_;
          auVar88 = vmaxps_avx(auVar17,auVar18);
          auVar17 = vsubps_avx(auVar160,auVar208._0_32_);
          auVar19._4_4_ = local_1420._4_4_ * auVar17._4_4_;
          auVar19._0_4_ = local_1420._0_4_ * auVar17._0_4_;
          auVar19._8_4_ = local_1420._8_4_ * auVar17._8_4_;
          auVar19._12_4_ = local_1420._12_4_ * auVar17._12_4_;
          auVar19._16_4_ = local_1420._16_4_ * auVar17._16_4_;
          auVar19._20_4_ = local_1420._20_4_ * auVar17._20_4_;
          auVar19._24_4_ = local_1420._24_4_ * auVar17._24_4_;
          auVar19._28_4_ = auVar17._28_4_;
          auVar17 = vmaxps_avx(auVar19,local_1440);
          auVar88 = vmaxps_avx(auVar88,auVar17);
          auVar17 = vsubps_avx(auVar99,auVar191._0_32_);
          auVar20._4_4_ = auVar211._4_4_ * auVar17._4_4_;
          auVar20._0_4_ = auVar211._0_4_ * auVar17._0_4_;
          auVar20._8_4_ = auVar211._8_4_ * auVar17._8_4_;
          auVar20._12_4_ = auVar211._12_4_ * auVar17._12_4_;
          auVar20._16_4_ = auVar211._16_4_ * auVar17._16_4_;
          auVar20._20_4_ = auVar211._20_4_ * auVar17._20_4_;
          auVar20._24_4_ = auVar211._24_4_ * auVar17._24_4_;
          auVar20._28_4_ = auVar17._28_4_;
          auVar17 = vsubps_avx(auVar130,auVar200._0_32_);
          auVar21._4_4_ = auVar220._4_4_ * auVar17._4_4_;
          auVar21._0_4_ = auVar220._0_4_ * auVar17._0_4_;
          auVar21._8_4_ = auVar220._8_4_ * auVar17._8_4_;
          auVar21._12_4_ = auVar220._12_4_ * auVar17._12_4_;
          auVar21._16_4_ = auVar220._16_4_ * auVar17._16_4_;
          auVar21._20_4_ = auVar220._20_4_ * auVar17._20_4_;
          auVar21._24_4_ = auVar220._24_4_ * auVar17._24_4_;
          auVar21._28_4_ = auVar17._28_4_;
          auVar17 = vminps_avx(auVar20,auVar21);
          auVar18 = vsubps_avx(auVar140,auVar208._0_32_);
          auVar22._4_4_ = local_1420._4_4_ * auVar18._4_4_;
          auVar22._0_4_ = local_1420._0_4_ * auVar18._0_4_;
          auVar22._8_4_ = local_1420._8_4_ * auVar18._8_4_;
          auVar22._12_4_ = local_1420._12_4_ * auVar18._12_4_;
          auVar22._16_4_ = local_1420._16_4_ * auVar18._16_4_;
          auVar22._20_4_ = local_1420._20_4_ * auVar18._20_4_;
          auVar22._24_4_ = local_1420._24_4_ * auVar18._24_4_;
          auVar22._28_4_ = auVar18._28_4_;
          auVar18 = vminps_avx(auVar22,local_1460);
          auVar17 = vminps_avx(auVar17,auVar18);
          auVar88 = vcmpps_avx(auVar88,auVar17,2);
          auVar125 = vpcmpeqd_avx(auVar17._0_16_,auVar17._0_16_);
          auVar74 = vpmovsxbd_avx(auVar74 ^ auVar125);
          auVar73 = vpmovsxbd_avx(auVar73 ^ auVar125);
          auVar75._16_16_ = auVar73;
          auVar75._0_16_ = auVar74;
          auVar17 = vcvtdq2ps_avx(auVar75);
          auVar77._8_4_ = 0xbf800000;
          auVar77._0_8_ = 0xbf800000bf800000;
          auVar77._12_4_ = 0xbf800000;
          auVar77._16_4_ = 0xbf800000;
          auVar77._20_4_ = 0xbf800000;
          auVar77._24_4_ = 0xbf800000;
          auVar77._28_4_ = 0xbf800000;
          auVar17 = vcmpps_avx(auVar77,auVar17,1);
          auVar88 = vandps_avx(auVar88,auVar17);
          uVar62 = vmovmskps_avx(auVar88);
          if (uVar62 == 0) goto LAB_00e77965;
          lVar11 = 0;
          if ((byte)uVar62 != 0) {
            for (; ((byte)uVar62 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
            }
          }
          uVar66 = *(ulong *)(uVar60 + lVar11 * 8);
          uVar62 = (uVar62 & 0xff) - 1 & uVar62 & 0xff;
          uVar64 = (ulong)uVar62;
          if (uVar62 != 0) {
            do {
              *local_1790 = uVar66;
              local_1790 = local_1790 + 1;
              lVar11 = 0;
              if (uVar64 != 0) {
                for (; (uVar64 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
                }
              }
              uVar66 = *(ulong *)(uVar60 + lVar11 * 8);
              uVar64 = uVar64 - 1 & uVar64;
            } while (uVar64 != 0);
          }
        }
        local_1748 = (ulong)((uint)uVar66 & 0xf) - 8;
        uVar66 = uVar66 & 0xfffffffffffffff0;
        for (local_1750 = 0; local_1750 != local_1748; local_1750 = local_1750 + 1) {
          lVar61 = local_1750 * 0x60;
          pSVar65 = context->scene;
          local_1788 = pSVar65;
          ppfVar5 = (pSVar65->vertices).items;
          pfVar6 = ppfVar5[*(uint *)(uVar66 + 0x40 + lVar61)];
          pfVar7 = ppfVar5[*(uint *)(uVar66 + 0x44 + lVar61)];
          pfVar8 = ppfVar5[*(uint *)(uVar66 + 0x48 + lVar61)];
          pfVar9 = ppfVar5[*(uint *)(uVar66 + 0x4c + lVar61)];
          auVar125 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar66 + lVar61)),
                                   *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar66 + 8 + lVar61)));
          auVar74 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar66 + lVar61)),
                                  *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar66 + 8 + lVar61)));
          auVar96 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar66 + 4 + lVar61)),
                                  *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar66 + 0xc + lVar61)))
          ;
          auVar73 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar66 + 4 + lVar61)),
                                  *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar66 + 0xc + lVar61)))
          ;
          auVar126 = vunpcklps_avx(auVar74,auVar73);
          auVar76 = vunpcklps_avx(auVar125,auVar96);
          auVar74 = vunpckhps_avx(auVar125,auVar96);
          auVar96 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar66 + 0x10 + lVar61))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar66 + 0x18 + lVar61)));
          auVar73 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar66 + 0x10 + lVar61))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar66 + 0x18 + lVar61)));
          auVar97 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar66 + 0x14 + lVar61))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar66 + 0x1c + lVar61)));
          auVar125 = vunpckhps_avx(*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar66 + 0x14 + lVar61)),
                                   *(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar66 + 0x1c + lVar61)));
          auVar86 = vunpcklps_avx(auVar73,auVar125);
          auVar87 = vunpcklps_avx(auVar96,auVar97);
          auVar73 = vunpckhps_avx(auVar96,auVar97);
          auVar97 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar66 + 0x20 + lVar61))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar66 + 0x28 + lVar61)));
          auVar125 = vunpckhps_avx(*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar66 + 0x20 + lVar61)),
                                   *(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar66 + 0x28 + lVar61)));
          auVar98 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar66 + 0x24 + lVar61))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar66 + 0x2c + lVar61)));
          auVar96 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar66 + 0x24 + lVar61))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar66 + 0x2c + lVar61)));
          auVar109 = vunpcklps_avx(auVar125,auVar96);
          auVar127 = vunpcklps_avx(auVar97,auVar98);
          auVar125 = vunpckhps_avx(auVar97,auVar98);
          auVar98 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar66 + 0x30 + lVar61))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar66 + 0x38 + lVar61)));
          auVar96 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar66 + 0x30 + lVar61))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar66 + 0x38 + lVar61)));
          auVar128 = vunpcklps_avx(*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar66 + 0x34 + lVar61)),
                                   *(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar66 + 0x3c + lVar61)));
          auVar97 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar66 + 0x34 + lVar61))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar66 + 0x3c + lVar61)));
          auVar97 = vunpcklps_avx(auVar96,auVar97);
          auVar139 = vunpcklps_avx(auVar98,auVar128);
          lVar11 = uVar66 + 0x40 + lVar61;
          local_13e0 = *(undefined8 *)(lVar11 + 0x10);
          uStack_13d8 = *(undefined8 *)(lVar11 + 0x18);
          auVar96 = vunpckhps_avx(auVar98,auVar128);
          uStack_13d0 = local_13e0;
          uStack_13c8 = uStack_13d8;
          lVar61 = uVar66 + 0x50 + lVar61;
          local_1400 = *(undefined8 *)(lVar61 + 0x10);
          uStack_13f8 = *(undefined8 *)(lVar61 + 0x18);
          uStack_13f0 = local_1400;
          uStack_13e8 = uStack_13f8;
          auVar131._16_16_ = auVar127;
          auVar131._0_16_ = auVar76;
          auVar153._16_16_ = auVar125;
          auVar153._0_16_ = auVar74;
          auVar78._16_16_ = auVar109;
          auVar78._0_16_ = auVar126;
          auVar112._16_16_ = auVar87;
          auVar112._0_16_ = auVar87;
          auVar210._16_16_ = auVar73;
          auVar210._0_16_ = auVar73;
          auVar90._16_16_ = auVar86;
          auVar90._0_16_ = auVar86;
          auVar178._16_16_ = auVar139;
          auVar178._0_16_ = auVar139;
          auVar161._16_16_ = auVar96;
          auVar161._0_16_ = auVar96;
          auVar188._16_16_ = auVar97;
          auVar188._0_16_ = auVar97;
          uVar3 = *(undefined4 *)&(ray->org).field_0;
          auVar190._4_4_ = uVar3;
          auVar190._0_4_ = uVar3;
          auVar190._8_4_ = uVar3;
          auVar190._12_4_ = uVar3;
          auVar190._16_4_ = uVar3;
          auVar190._20_4_ = uVar3;
          auVar190._24_4_ = uVar3;
          auVar190._28_4_ = uVar3;
          uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
          auVar199._4_4_ = uVar3;
          auVar199._0_4_ = uVar3;
          auVar199._8_4_ = uVar3;
          auVar199._12_4_ = uVar3;
          auVar199._16_4_ = uVar3;
          auVar199._20_4_ = uVar3;
          auVar199._24_4_ = uVar3;
          auVar199._28_4_ = uVar3;
          uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
          auVar207._4_4_ = uVar3;
          auVar207._0_4_ = uVar3;
          auVar207._8_4_ = uVar3;
          auVar207._12_4_ = uVar3;
          auVar207._16_4_ = uVar3;
          auVar207._20_4_ = uVar3;
          auVar207._24_4_ = uVar3;
          auVar207._28_4_ = uVar3;
          local_1640 = vsubps_avx(auVar131,auVar190);
          local_1660 = vsubps_avx(auVar153,auVar199);
          local_1680 = vsubps_avx(auVar78,auVar207);
          auVar88 = vsubps_avx(auVar112,auVar190);
          auVar17 = vsubps_avx(auVar210,auVar199);
          auVar18 = vsubps_avx(auVar90,auVar207);
          auVar19 = vsubps_avx(auVar178,auVar190);
          auVar20 = vsubps_avx(auVar161,auVar199);
          auVar21 = vsubps_avx(auVar188,auVar207);
          local_16a0 = vsubps_avx(auVar19,local_1640);
          local_16c0 = vsubps_avx(auVar20,local_1660);
          local_1480 = vsubps_avx(auVar21,local_1680);
          fVar106 = local_1660._0_4_;
          fVar107 = auVar20._0_4_ + fVar106;
          fVar117 = local_1660._4_4_;
          fVar115 = auVar20._4_4_ + fVar117;
          fVar12 = local_1660._8_4_;
          fVar118 = auVar20._8_4_ + fVar12;
          fVar81 = local_1660._12_4_;
          fVar120 = auVar20._12_4_ + fVar81;
          fVar83 = local_1660._16_4_;
          fVar121 = auVar20._16_4_ + fVar83;
          fVar85 = local_1660._20_4_;
          fVar122 = auVar20._20_4_ + fVar85;
          fVar15 = local_1660._24_4_;
          fVar123 = auVar20._24_4_ + fVar15;
          fVar72 = local_1660._28_4_;
          fVar218 = local_1680._0_4_;
          fVar124 = fVar218 + auVar21._0_4_;
          fVar221 = local_1680._4_4_;
          fVar132 = fVar221 + auVar21._4_4_;
          fVar223 = local_1680._8_4_;
          fVar133 = fVar223 + auVar21._8_4_;
          fVar225 = local_1680._12_4_;
          fVar134 = fVar225 + auVar21._12_4_;
          fVar227 = local_1680._16_4_;
          fVar135 = fVar227 + auVar21._16_4_;
          fVar229 = local_1680._20_4_;
          fVar136 = fVar229 + auVar21._20_4_;
          fVar231 = local_1680._24_4_;
          fVar137 = fVar231 + auVar21._24_4_;
          fVar93 = local_1680._28_4_;
          fVar138 = local_1480._0_4_;
          fVar144 = local_1480._4_4_;
          auVar23._4_4_ = fVar144 * fVar115;
          auVar23._0_4_ = fVar138 * fVar107;
          fVar145 = local_1480._8_4_;
          auVar23._8_4_ = fVar145 * fVar118;
          fVar146 = local_1480._12_4_;
          auVar23._12_4_ = fVar146 * fVar120;
          fVar147 = local_1480._16_4_;
          auVar23._16_4_ = fVar147 * fVar121;
          fVar148 = local_1480._20_4_;
          auVar23._20_4_ = fVar148 * fVar122;
          fVar149 = local_1480._24_4_;
          auVar23._24_4_ = fVar149 * fVar123;
          auVar23._28_4_ = auVar96._12_4_;
          fVar198 = local_16c0._0_4_;
          fVar201 = local_16c0._4_4_;
          auVar24._4_4_ = fVar201 * fVar132;
          auVar24._0_4_ = fVar198 * fVar124;
          fVar202 = local_16c0._8_4_;
          auVar24._8_4_ = fVar202 * fVar133;
          fVar203 = local_16c0._12_4_;
          auVar24._12_4_ = fVar203 * fVar134;
          fVar204 = local_16c0._16_4_;
          auVar24._16_4_ = fVar204 * fVar135;
          fVar205 = local_16c0._20_4_;
          auVar24._20_4_ = fVar205 * fVar136;
          fVar206 = local_16c0._24_4_;
          auVar24._24_4_ = fVar206 * fVar137;
          auVar24._28_4_ = auVar139._12_4_;
          auVar22 = vsubps_avx(auVar24,auVar23);
          fVar114 = local_1640._0_4_;
          fVar174 = auVar19._0_4_ + fVar114;
          fVar119 = local_1640._4_4_;
          fVar180 = auVar19._4_4_ + fVar119;
          fVar13 = local_1640._8_4_;
          fVar181 = auVar19._8_4_ + fVar13;
          fVar82 = local_1640._12_4_;
          fVar182 = auVar19._12_4_ + fVar82;
          fVar84 = local_1640._16_4_;
          fVar183 = auVar19._16_4_ + fVar84;
          fVar14 = local_1640._20_4_;
          fVar184 = auVar19._20_4_ + fVar14;
          fVar16 = local_1640._24_4_;
          fVar185 = auVar19._24_4_ + fVar16;
          fVar189 = local_16a0._0_4_;
          fVar192 = local_16a0._4_4_;
          auVar25._4_4_ = fVar192 * fVar132;
          auVar25._0_4_ = fVar189 * fVar124;
          fVar193 = local_16a0._8_4_;
          auVar25._8_4_ = fVar193 * fVar133;
          fVar194 = local_16a0._12_4_;
          auVar25._12_4_ = fVar194 * fVar134;
          fVar195 = local_16a0._16_4_;
          auVar25._16_4_ = fVar195 * fVar135;
          fVar196 = local_16a0._20_4_;
          auVar25._20_4_ = fVar196 * fVar136;
          fVar197 = local_16a0._24_4_;
          auVar25._24_4_ = fVar197 * fVar137;
          auVar25._28_4_ = fVar93 + auVar21._28_4_;
          auVar89 = local_1480;
          auVar26._4_4_ = fVar180 * fVar144;
          auVar26._0_4_ = fVar174 * fVar138;
          auVar26._8_4_ = fVar181 * fVar145;
          auVar26._12_4_ = fVar182 * fVar146;
          auVar26._16_4_ = fVar183 * fVar147;
          auVar26._20_4_ = fVar184 * fVar148;
          auVar26._24_4_ = fVar185 * fVar149;
          auVar26._28_4_ = auVar97._12_4_;
          auVar75 = vsubps_avx(auVar26,auVar25);
          auVar27._4_4_ = fVar201 * fVar180;
          auVar27._0_4_ = fVar198 * fVar174;
          auVar27._8_4_ = fVar202 * fVar181;
          auVar27._12_4_ = fVar203 * fVar182;
          auVar27._16_4_ = fVar204 * fVar183;
          auVar27._20_4_ = fVar205 * fVar184;
          auVar27._24_4_ = fVar206 * fVar185;
          auVar27._28_4_ = auVar19._28_4_ + local_1640._28_4_;
          auVar28._4_4_ = fVar192 * fVar115;
          auVar28._0_4_ = fVar189 * fVar107;
          auVar28._8_4_ = fVar193 * fVar118;
          auVar28._12_4_ = fVar194 * fVar120;
          auVar28._16_4_ = fVar195 * fVar121;
          auVar28._20_4_ = fVar196 * fVar122;
          auVar28._24_4_ = fVar197 * fVar123;
          auVar28._28_4_ = auVar20._28_4_ + fVar72;
          auVar77 = vsubps_avx(auVar28,auVar27);
          local_1780._4_4_ = (ray->dir).field_0.m128[1];
          fVar107 = (ray->dir).field_0.m128[2];
          local_1740._4_4_ = fVar107;
          local_1740._0_4_ = fVar107;
          local_1740._8_4_ = fVar107;
          local_1740._12_4_ = fVar107;
          local_1740._16_4_ = fVar107;
          local_1740._20_4_ = fVar107;
          local_1740._24_4_ = fVar107;
          local_1740._28_4_ = fVar107;
          local_1620 = (ray->dir).field_0.m128[0];
          fStack_161c = local_1620;
          fStack_1618 = local_1620;
          fStack_1614 = local_1620;
          fStack_1610 = local_1620;
          fStack_160c = local_1620;
          fStack_1608 = local_1620;
          fStack_1604 = local_1620;
          local_14e0._0_4_ =
               local_1620 * auVar22._0_4_ +
               local_1780._4_4_ * auVar75._0_4_ + fVar107 * auVar77._0_4_;
          local_14e0._4_4_ =
               local_1620 * auVar22._4_4_ +
               local_1780._4_4_ * auVar75._4_4_ + fVar107 * auVar77._4_4_;
          local_14e0._8_4_ =
               local_1620 * auVar22._8_4_ +
               local_1780._4_4_ * auVar75._8_4_ + fVar107 * auVar77._8_4_;
          local_14e0._12_4_ =
               local_1620 * auVar22._12_4_ +
               local_1780._4_4_ * auVar75._12_4_ + fVar107 * auVar77._12_4_;
          local_14e0._16_4_ =
               local_1620 * auVar22._16_4_ +
               local_1780._4_4_ * auVar75._16_4_ + fVar107 * auVar77._16_4_;
          local_14e0._20_4_ =
               local_1620 * auVar22._20_4_ +
               local_1780._4_4_ * auVar75._20_4_ + fVar107 * auVar77._20_4_;
          local_14e0._24_4_ =
               local_1620 * auVar22._24_4_ +
               local_1780._4_4_ * auVar75._24_4_ + fVar107 * auVar77._24_4_;
          local_14e0._28_4_ = auVar75._28_4_ + auVar75._28_4_ + auVar77._28_4_;
          local_14a0 = vsubps_avx(local_1660,auVar17);
          auVar22 = vsubps_avx(local_1680,auVar18);
          fVar118 = fVar106 + auVar17._0_4_;
          fVar120 = fVar117 + auVar17._4_4_;
          fVar121 = fVar12 + auVar17._8_4_;
          fVar122 = fVar81 + auVar17._12_4_;
          fVar123 = fVar83 + auVar17._16_4_;
          fVar124 = fVar85 + auVar17._20_4_;
          fVar132 = fVar15 + auVar17._24_4_;
          fVar115 = auVar17._28_4_;
          fVar133 = fVar218 + auVar18._0_4_;
          fVar134 = fVar221 + auVar18._4_4_;
          fVar135 = fVar223 + auVar18._8_4_;
          fVar136 = fVar225 + auVar18._12_4_;
          fVar137 = fVar227 + auVar18._16_4_;
          fVar174 = fVar229 + auVar18._20_4_;
          fVar180 = fVar231 + auVar18._24_4_;
          fVar209 = auVar22._0_4_;
          fVar212 = auVar22._4_4_;
          auVar29._4_4_ = fVar212 * fVar120;
          auVar29._0_4_ = fVar209 * fVar118;
          fVar213 = auVar22._8_4_;
          auVar29._8_4_ = fVar213 * fVar121;
          fVar214 = auVar22._12_4_;
          auVar29._12_4_ = fVar214 * fVar122;
          fVar215 = auVar22._16_4_;
          auVar29._16_4_ = fVar215 * fVar123;
          fVar216 = auVar22._20_4_;
          auVar29._20_4_ = fVar216 * fVar124;
          fVar217 = auVar22._24_4_;
          auVar29._24_4_ = fVar217 * fVar132;
          auVar29._28_4_ = fVar93;
          fVar155 = local_14a0._0_4_;
          fVar162 = local_14a0._4_4_;
          auVar30._4_4_ = fVar162 * fVar134;
          auVar30._0_4_ = fVar155 * fVar133;
          fVar164 = local_14a0._8_4_;
          auVar30._8_4_ = fVar164 * fVar135;
          fVar166 = local_14a0._12_4_;
          auVar30._12_4_ = fVar166 * fVar136;
          fVar168 = local_14a0._16_4_;
          auVar30._16_4_ = fVar168 * fVar137;
          fVar170 = local_14a0._20_4_;
          auVar30._20_4_ = fVar170 * fVar174;
          fVar172 = local_14a0._24_4_;
          auVar30._24_4_ = fVar172 * fVar180;
          auVar30._28_4_ = fVar72;
          auVar22 = vsubps_avx(auVar30,auVar29);
          auVar75 = vsubps_avx(local_1640,auVar88);
          fVar219 = auVar75._0_4_;
          fVar222 = auVar75._4_4_;
          auVar31._4_4_ = fVar222 * fVar134;
          auVar31._0_4_ = fVar219 * fVar133;
          fVar224 = auVar75._8_4_;
          auVar31._8_4_ = fVar224 * fVar135;
          fVar226 = auVar75._12_4_;
          auVar31._12_4_ = fVar226 * fVar136;
          fVar228 = auVar75._16_4_;
          auVar31._16_4_ = fVar228 * fVar137;
          fVar230 = auVar75._20_4_;
          auVar31._20_4_ = fVar230 * fVar174;
          fVar232 = auVar75._24_4_;
          auVar31._24_4_ = fVar232 * fVar180;
          auVar31._28_4_ = fVar93 + auVar18._28_4_;
          fVar133 = auVar88._0_4_ + fVar114;
          fVar134 = auVar88._4_4_ + fVar119;
          fVar135 = auVar88._8_4_ + fVar13;
          fVar136 = auVar88._12_4_ + fVar82;
          fVar137 = auVar88._16_4_ + fVar84;
          fVar174 = auVar88._20_4_ + fVar14;
          fVar180 = auVar88._24_4_ + fVar16;
          fVar94 = auVar88._28_4_;
          fVar186 = fVar94 + local_1640._28_4_;
          auVar32._4_4_ = fVar212 * fVar134;
          auVar32._0_4_ = fVar209 * fVar133;
          auVar32._8_4_ = fVar213 * fVar135;
          auVar32._12_4_ = fVar214 * fVar136;
          auVar32._16_4_ = fVar215 * fVar137;
          auVar32._20_4_ = fVar216 * fVar174;
          auVar32._24_4_ = fVar217 * fVar180;
          auVar32._28_4_ = fVar94;
          auVar75 = vsubps_avx(auVar32,auVar31);
          auVar33._4_4_ = fVar162 * fVar134;
          auVar33._0_4_ = fVar155 * fVar133;
          auVar33._8_4_ = fVar164 * fVar135;
          auVar33._12_4_ = fVar166 * fVar136;
          auVar33._16_4_ = fVar168 * fVar137;
          auVar33._20_4_ = fVar170 * fVar174;
          auVar33._24_4_ = fVar172 * fVar180;
          auVar33._28_4_ = fVar186;
          auVar34._4_4_ = fVar222 * fVar120;
          auVar34._0_4_ = fVar219 * fVar118;
          auVar34._8_4_ = fVar224 * fVar121;
          auVar34._12_4_ = fVar226 * fVar122;
          auVar34._16_4_ = fVar228 * fVar123;
          auVar34._20_4_ = fVar230 * fVar124;
          auVar34._24_4_ = fVar232 * fVar132;
          auVar34._28_4_ = fVar72 + fVar115;
          auVar77 = vsubps_avx(auVar34,auVar33);
          local_1500._0_4_ =
               local_1620 * auVar22._0_4_ +
               local_1780._4_4_ * auVar75._0_4_ + fVar107 * auVar77._0_4_;
          local_1500._4_4_ =
               local_1620 * auVar22._4_4_ +
               local_1780._4_4_ * auVar75._4_4_ + fVar107 * auVar77._4_4_;
          local_1500._8_4_ =
               local_1620 * auVar22._8_4_ +
               local_1780._4_4_ * auVar75._8_4_ + fVar107 * auVar77._8_4_;
          local_1500._12_4_ =
               local_1620 * auVar22._12_4_ +
               local_1780._4_4_ * auVar75._12_4_ + fVar107 * auVar77._12_4_;
          local_1500._16_4_ =
               local_1620 * auVar22._16_4_ +
               local_1780._4_4_ * auVar75._16_4_ + fVar107 * auVar77._16_4_;
          local_1500._20_4_ =
               local_1620 * auVar22._20_4_ +
               local_1780._4_4_ * auVar75._20_4_ + fVar107 * auVar77._20_4_;
          local_1500._24_4_ =
               local_1620 * auVar22._24_4_ +
               local_1780._4_4_ * auVar75._24_4_ + fVar107 * auVar77._24_4_;
          local_1500._28_4_ = auVar22._28_4_ + auVar75._28_4_ + auVar77._28_4_;
          local_14c0 = vsubps_avx(auVar88,auVar19);
          fVar180 = auVar88._0_4_ + auVar19._0_4_;
          fVar181 = auVar88._4_4_ + auVar19._4_4_;
          fVar182 = auVar88._8_4_ + auVar19._8_4_;
          fVar183 = auVar88._12_4_ + auVar19._12_4_;
          fVar184 = auVar88._16_4_ + auVar19._16_4_;
          fVar185 = auVar88._20_4_ + auVar19._20_4_;
          fVar93 = auVar88._24_4_ + auVar19._24_4_;
          fVar94 = fVar94 + auVar19._28_4_;
          auVar19 = vsubps_avx(auVar17,auVar20);
          fVar132 = auVar17._0_4_ + auVar20._0_4_;
          fVar133 = auVar17._4_4_ + auVar20._4_4_;
          fVar134 = auVar17._8_4_ + auVar20._8_4_;
          fVar135 = auVar17._12_4_ + auVar20._12_4_;
          fVar136 = auVar17._16_4_ + auVar20._16_4_;
          fVar137 = auVar17._20_4_ + auVar20._20_4_;
          fVar174 = auVar17._24_4_ + auVar20._24_4_;
          auVar88 = vsubps_avx(auVar18,auVar21);
          fVar95 = auVar18._0_4_ + auVar21._0_4_;
          fVar100 = auVar18._4_4_ + auVar21._4_4_;
          fVar101 = auVar18._8_4_ + auVar21._8_4_;
          fVar102 = auVar18._12_4_ + auVar21._12_4_;
          fVar103 = auVar18._16_4_ + auVar21._16_4_;
          fVar104 = auVar18._20_4_ + auVar21._20_4_;
          fVar105 = auVar18._24_4_ + auVar21._24_4_;
          fVar72 = auVar88._0_4_;
          fVar118 = auVar88._4_4_;
          auVar35._4_4_ = fVar118 * fVar133;
          auVar35._0_4_ = fVar72 * fVar132;
          fVar120 = auVar88._8_4_;
          auVar35._8_4_ = fVar120 * fVar134;
          fVar121 = auVar88._12_4_;
          auVar35._12_4_ = fVar121 * fVar135;
          fVar122 = auVar88._16_4_;
          auVar35._16_4_ = fVar122 * fVar136;
          fVar123 = auVar88._20_4_;
          auVar35._20_4_ = fVar123 * fVar137;
          fVar124 = auVar88._24_4_;
          auVar35._24_4_ = fVar124 * fVar174;
          auVar35._28_4_ = fVar115;
          fVar156 = auVar19._0_4_;
          fVar163 = auVar19._4_4_;
          auVar36._4_4_ = fVar163 * fVar100;
          auVar36._0_4_ = fVar156 * fVar95;
          fVar165 = auVar19._8_4_;
          auVar36._8_4_ = fVar165 * fVar101;
          fVar167 = auVar19._12_4_;
          auVar36._12_4_ = fVar167 * fVar102;
          fVar169 = auVar19._16_4_;
          auVar36._16_4_ = fVar169 * fVar103;
          fVar171 = auVar19._20_4_;
          auVar36._20_4_ = fVar171 * fVar104;
          fVar173 = auVar19._24_4_;
          auVar36._24_4_ = fVar173 * fVar105;
          auVar36._28_4_ = fVar186;
          auVar88 = vsubps_avx(auVar36,auVar35);
          fVar108 = local_14c0._0_4_;
          fVar116 = local_14c0._4_4_;
          auVar37._4_4_ = fVar116 * fVar100;
          auVar37._0_4_ = fVar108 * fVar95;
          fVar95 = local_14c0._8_4_;
          auVar37._8_4_ = fVar95 * fVar101;
          fVar100 = local_14c0._12_4_;
          auVar37._12_4_ = fVar100 * fVar102;
          fVar101 = local_14c0._16_4_;
          auVar37._16_4_ = fVar101 * fVar103;
          fVar102 = local_14c0._20_4_;
          auVar37._20_4_ = fVar102 * fVar104;
          fVar103 = local_14c0._24_4_;
          auVar37._24_4_ = fVar103 * fVar105;
          auVar37._28_4_ = auVar18._28_4_ + auVar21._28_4_;
          auVar38._4_4_ = fVar118 * fVar181;
          auVar38._0_4_ = fVar72 * fVar180;
          auVar38._8_4_ = fVar120 * fVar182;
          auVar38._12_4_ = fVar121 * fVar183;
          auVar38._16_4_ = fVar122 * fVar184;
          auVar38._20_4_ = fVar123 * fVar185;
          auVar38._24_4_ = fVar124 * fVar93;
          auVar38._28_4_ = fVar186;
          auVar17 = vsubps_avx(auVar38,auVar37);
          auVar39._4_4_ = fVar163 * fVar181;
          auVar39._0_4_ = fVar156 * fVar180;
          auVar39._8_4_ = fVar165 * fVar182;
          auVar39._12_4_ = fVar167 * fVar183;
          auVar39._16_4_ = fVar169 * fVar184;
          auVar39._20_4_ = fVar171 * fVar185;
          auVar39._24_4_ = fVar173 * fVar93;
          auVar39._28_4_ = fVar94;
          auVar21 = local_14c0;
          auVar40._4_4_ = fVar116 * fVar133;
          auVar40._0_4_ = fVar108 * fVar132;
          auVar40._8_4_ = fVar95 * fVar134;
          auVar40._12_4_ = fVar100 * fVar135;
          auVar40._16_4_ = fVar101 * fVar136;
          auVar40._20_4_ = fVar102 * fVar137;
          auVar40._24_4_ = fVar103 * fVar174;
          auVar40._28_4_ = fVar115 + auVar20._28_4_;
          auVar18 = vsubps_avx(auVar40,auVar39);
          local_1780._0_4_ = local_1780._4_4_;
          fStack_1778 = local_1780._4_4_;
          fStack_1774 = local_1780._4_4_;
          fStack_1770 = local_1780._4_4_;
          fStack_176c = local_1780._4_4_;
          fStack_1768 = local_1780._4_4_;
          fStack_1764 = local_1780._4_4_;
          auVar79._0_4_ =
               local_1620 * auVar88._0_4_ +
               local_1780._4_4_ * auVar17._0_4_ + fVar107 * auVar18._0_4_;
          auVar79._4_4_ =
               local_1620 * auVar88._4_4_ +
               local_1780._4_4_ * auVar17._4_4_ + fVar107 * auVar18._4_4_;
          auVar79._8_4_ =
               local_1620 * auVar88._8_4_ +
               local_1780._4_4_ * auVar17._8_4_ + fVar107 * auVar18._8_4_;
          auVar79._12_4_ =
               local_1620 * auVar88._12_4_ +
               local_1780._4_4_ * auVar17._12_4_ + fVar107 * auVar18._12_4_;
          auVar79._16_4_ =
               local_1620 * auVar88._16_4_ +
               local_1780._4_4_ * auVar17._16_4_ + fVar107 * auVar18._16_4_;
          auVar79._20_4_ =
               local_1620 * auVar88._20_4_ +
               local_1780._4_4_ * auVar17._20_4_ + fVar107 * auVar18._20_4_;
          auVar79._24_4_ =
               local_1620 * auVar88._24_4_ +
               local_1780._4_4_ * auVar17._24_4_ + fVar107 * auVar18._24_4_;
          auVar79._28_4_ = fVar94 + fVar94 + auVar18._28_4_;
          local_1520._0_4_ = auVar79._0_4_ + local_14e0._0_4_ + local_1500._0_4_;
          local_1520._4_4_ = auVar79._4_4_ + local_14e0._4_4_ + local_1500._4_4_;
          local_1520._8_4_ = auVar79._8_4_ + local_14e0._8_4_ + local_1500._8_4_;
          local_1520._12_4_ = auVar79._12_4_ + local_14e0._12_4_ + local_1500._12_4_;
          local_1520._16_4_ = auVar79._16_4_ + local_14e0._16_4_ + local_1500._16_4_;
          local_1520._20_4_ = auVar79._20_4_ + local_14e0._20_4_ + local_1500._20_4_;
          local_1520._24_4_ = auVar79._24_4_ + local_14e0._24_4_ + local_1500._24_4_;
          local_1520._28_4_ = auVar79._28_4_ + local_14e0._28_4_ + local_1500._28_4_;
          auVar88 = vminps_avx(local_14e0,local_1500);
          auVar88 = vminps_avx(auVar88,auVar79);
          auVar113._8_4_ = 0x7fffffff;
          auVar113._0_8_ = 0x7fffffff7fffffff;
          auVar113._12_4_ = 0x7fffffff;
          auVar113._16_4_ = 0x7fffffff;
          auVar113._20_4_ = 0x7fffffff;
          auVar113._24_4_ = 0x7fffffff;
          auVar113._28_4_ = 0x7fffffff;
          local_1540 = vandps_avx(local_1520,auVar113);
          fVar115 = local_1540._0_4_ * 1.1920929e-07;
          fVar132 = local_1540._4_4_ * 1.1920929e-07;
          auVar41._4_4_ = fVar132;
          auVar41._0_4_ = fVar115;
          fVar133 = local_1540._8_4_ * 1.1920929e-07;
          auVar41._8_4_ = fVar133;
          fVar134 = local_1540._12_4_ * 1.1920929e-07;
          auVar41._12_4_ = fVar134;
          fVar135 = local_1540._16_4_ * 1.1920929e-07;
          auVar41._16_4_ = fVar135;
          fVar136 = local_1540._20_4_ * 1.1920929e-07;
          auVar41._20_4_ = fVar136;
          fVar137 = local_1540._24_4_ * 1.1920929e-07;
          auVar41._24_4_ = fVar137;
          auVar41._28_4_ = 0x34000000;
          auVar179._0_8_ = CONCAT44(fVar132,fVar115) ^ 0x8000000080000000;
          auVar179._8_4_ = -fVar133;
          auVar179._12_4_ = -fVar134;
          auVar179._16_4_ = -fVar135;
          auVar179._20_4_ = -fVar136;
          auVar179._24_4_ = -fVar137;
          auVar179._28_4_ = 0xb4000000;
          auVar88 = vcmpps_avx(auVar88,auVar179,5);
          auVar18 = vmaxps_avx(local_14e0,local_1500);
          auVar17 = vmaxps_avx(auVar18,auVar79);
          auVar17 = vcmpps_avx(auVar17,auVar41,2);
          auVar17 = vorps_avx(auVar88,auVar17);
          auVar154._8_4_ = 0x3f800000;
          auVar154._0_8_ = 0x3f8000003f800000;
          auVar154._12_4_ = 0x3f800000;
          auVar154._16_4_ = 0x3f800000;
          auVar154._20_4_ = 0x3f800000;
          auVar154._24_4_ = 0x3f800000;
          auVar154._28_4_ = 0x3f800000;
          if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar17 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar17 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar17 >> 0x7f,0) == '\0') &&
                (auVar17 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar17 >> 0xbf,0) == '\0') &&
              (auVar17 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar17[0x1f]) {
LAB_00e78528:
            auVar191 = ZEXT3264(local_1580);
            auVar200 = ZEXT3264(local_15a0);
            auVar208 = ZEXT3264(local_15c0);
            auVar211 = ZEXT3264(local_15e0);
            auVar220 = ZEXT3264(local_1600);
          }
          else {
            auVar42._4_4_ = fVar162 * fVar144;
            auVar42._0_4_ = fVar155 * fVar138;
            auVar42._8_4_ = fVar164 * fVar145;
            auVar42._12_4_ = fVar166 * fVar146;
            auVar42._16_4_ = fVar168 * fVar147;
            auVar42._20_4_ = fVar170 * fVar148;
            auVar42._24_4_ = fVar172 * fVar149;
            auVar42._28_4_ = auVar88._28_4_;
            auVar43._4_4_ = fVar201 * fVar212;
            auVar43._0_4_ = fVar198 * fVar209;
            auVar43._8_4_ = fVar202 * fVar213;
            auVar43._12_4_ = fVar203 * fVar214;
            auVar43._16_4_ = fVar204 * fVar215;
            auVar43._20_4_ = fVar205 * fVar216;
            auVar43._24_4_ = fVar206 * fVar217;
            auVar43._28_4_ = 0x34000000;
            auVar20 = vsubps_avx(auVar43,auVar42);
            auVar44._4_4_ = fVar212 * fVar163;
            auVar44._0_4_ = fVar209 * fVar156;
            auVar44._8_4_ = fVar213 * fVar165;
            auVar44._12_4_ = fVar214 * fVar167;
            auVar44._16_4_ = fVar215 * fVar169;
            auVar44._20_4_ = fVar216 * fVar171;
            auVar44._24_4_ = fVar217 * fVar173;
            auVar44._28_4_ = auVar18._28_4_;
            auVar45._4_4_ = fVar162 * fVar118;
            auVar45._0_4_ = fVar155 * fVar72;
            auVar45._8_4_ = fVar164 * fVar120;
            auVar45._12_4_ = fVar166 * fVar121;
            auVar45._16_4_ = fVar168 * fVar122;
            auVar45._20_4_ = fVar170 * fVar123;
            auVar45._24_4_ = fVar172 * fVar124;
            auVar45._28_4_ = local_1500._28_4_;
            auVar22 = vsubps_avx(auVar45,auVar44);
            auVar88 = vandps_avx(auVar42,auVar113);
            auVar18 = vandps_avx(auVar44,auVar113);
            auVar88 = vcmpps_avx(auVar88,auVar18,1);
            local_1360 = vblendvps_avx(auVar22,auVar20,auVar88);
            auVar46._4_4_ = fVar222 * fVar118;
            auVar46._0_4_ = fVar219 * fVar72;
            auVar46._8_4_ = fVar224 * fVar120;
            auVar46._12_4_ = fVar226 * fVar121;
            auVar46._16_4_ = fVar228 * fVar122;
            auVar46._20_4_ = fVar230 * fVar123;
            auVar46._24_4_ = fVar232 * fVar124;
            auVar46._28_4_ = auVar88._28_4_;
            auVar47._4_4_ = fVar222 * fVar144;
            auVar47._0_4_ = fVar219 * fVar138;
            auVar47._8_4_ = fVar224 * fVar145;
            auVar47._12_4_ = fVar226 * fVar146;
            auVar47._16_4_ = fVar228 * fVar147;
            auVar47._20_4_ = fVar230 * fVar148;
            auVar47._24_4_ = fVar232 * fVar149;
            auVar47._28_4_ = auVar20._28_4_;
            auVar48._4_4_ = fVar192 * fVar212;
            auVar48._0_4_ = fVar189 * fVar209;
            auVar48._8_4_ = fVar193 * fVar213;
            auVar48._12_4_ = fVar194 * fVar214;
            auVar48._16_4_ = fVar195 * fVar215;
            auVar48._20_4_ = fVar196 * fVar216;
            auVar48._24_4_ = fVar197 * fVar217;
            auVar48._28_4_ = local_1480._28_4_;
            auVar20 = vsubps_avx(auVar47,auVar48);
            auVar49._4_4_ = fVar212 * fVar116;
            auVar49._0_4_ = fVar209 * fVar108;
            auVar49._8_4_ = fVar213 * fVar95;
            auVar49._12_4_ = fVar214 * fVar100;
            auVar49._16_4_ = fVar215 * fVar101;
            auVar49._20_4_ = fVar216 * fVar102;
            auVar49._24_4_ = fVar217 * fVar103;
            auVar49._28_4_ = auVar19._28_4_;
            auVar22 = vsubps_avx(auVar49,auVar46);
            auVar88 = vandps_avx(auVar48,auVar113);
            auVar18 = vandps_avx(auVar46,auVar113);
            auVar88 = vcmpps_avx(auVar88,auVar18,1);
            local_1340 = vblendvps_avx(auVar22,auVar20,auVar88);
            auVar50._4_4_ = fVar162 * fVar116;
            auVar50._0_4_ = fVar155 * fVar108;
            auVar50._8_4_ = fVar164 * fVar95;
            auVar50._12_4_ = fVar166 * fVar100;
            auVar50._16_4_ = fVar168 * fVar101;
            auVar50._20_4_ = fVar170 * fVar102;
            auVar50._24_4_ = fVar172 * fVar103;
            auVar50._28_4_ = auVar88._28_4_;
            auVar51._4_4_ = fVar192 * fVar162;
            auVar51._0_4_ = fVar189 * fVar155;
            auVar51._8_4_ = fVar193 * fVar164;
            auVar51._12_4_ = fVar194 * fVar166;
            auVar51._16_4_ = fVar195 * fVar168;
            auVar51._20_4_ = fVar196 * fVar170;
            auVar51._24_4_ = fVar197 * fVar172;
            auVar51._28_4_ = auVar20._28_4_;
            auVar52._4_4_ = fVar201 * fVar222;
            auVar52._0_4_ = fVar198 * fVar219;
            auVar52._8_4_ = fVar202 * fVar224;
            auVar52._12_4_ = fVar203 * fVar226;
            auVar52._16_4_ = fVar204 * fVar228;
            auVar52._20_4_ = fVar205 * fVar230;
            auVar52._24_4_ = fVar206 * fVar232;
            auVar52._28_4_ = local_14c0._28_4_;
            auVar53._4_4_ = fVar222 * fVar163;
            auVar53._0_4_ = fVar219 * fVar156;
            auVar53._8_4_ = fVar224 * fVar165;
            auVar53._12_4_ = fVar226 * fVar167;
            auVar53._16_4_ = fVar228 * fVar169;
            auVar53._20_4_ = fVar230 * fVar171;
            auVar53._24_4_ = fVar232 * fVar173;
            auVar53._28_4_ = auVar19._28_4_;
            auVar19 = vsubps_avx(auVar51,auVar52);
            auVar20 = vsubps_avx(auVar53,auVar50);
            auVar88 = vandps_avx(auVar52,auVar113);
            auVar18 = vandps_avx(auVar50,auVar113);
            auVar88 = vcmpps_avx(auVar88,auVar18,1);
            local_1320 = vblendvps_avx(auVar20,auVar19,auVar88);
            auVar74 = vpackssdw_avx(auVar17._0_16_,auVar17._16_16_);
            fVar174 = local_1320._0_4_;
            fVar180 = local_1320._4_4_;
            fVar181 = local_1320._8_4_;
            fVar182 = local_1320._12_4_;
            fVar183 = local_1320._16_4_;
            fVar184 = local_1320._20_4_;
            fVar185 = local_1320._24_4_;
            fVar93 = local_1340._0_4_;
            fVar94 = local_1340._4_4_;
            fVar95 = local_1340._8_4_;
            fVar100 = local_1340._12_4_;
            fVar101 = local_1340._16_4_;
            fVar102 = local_1340._20_4_;
            fVar103 = local_1340._24_4_;
            fVar72 = local_1360._0_4_;
            fVar115 = local_1360._4_4_;
            fVar118 = local_1360._8_4_;
            fVar120 = local_1360._12_4_;
            fVar121 = local_1360._16_4_;
            fVar122 = local_1360._20_4_;
            fVar123 = local_1360._24_4_;
            fVar124 = local_1620 * fVar72 + fVar93 * local_1780._4_4_ + fVar174 * fVar107;
            fVar132 = local_1620 * fVar115 + fVar94 * local_1780._4_4_ + fVar180 * fVar107;
            fVar133 = local_1620 * fVar118 + fVar95 * local_1780._4_4_ + fVar181 * fVar107;
            fVar134 = local_1620 * fVar120 + fVar100 * local_1780._4_4_ + fVar182 * fVar107;
            fVar135 = local_1620 * fVar121 + fVar101 * local_1780._4_4_ + fVar183 * fVar107;
            fVar136 = local_1620 * fVar122 + fVar102 * local_1780._4_4_ + fVar184 * fVar107;
            fVar107 = local_1620 * fVar123 + fVar103 * local_1780._4_4_ + fVar185 * fVar107;
            fVar137 = auVar88._28_4_ + auVar88._28_4_ + auVar17._28_4_;
            auVar91._0_4_ = fVar124 + fVar124;
            auVar91._4_4_ = fVar132 + fVar132;
            auVar91._8_4_ = fVar133 + fVar133;
            auVar91._12_4_ = fVar134 + fVar134;
            auVar91._16_4_ = fVar135 + fVar135;
            auVar91._20_4_ = fVar136 + fVar136;
            auVar91._24_4_ = fVar107 + fVar107;
            auVar91._28_4_ = fVar137 + fVar137;
            fVar124 = auVar19._28_4_;
            auVar88 = vrcpps_avx(auVar91);
            fVar132 = fVar72 * fVar114 + fVar93 * fVar106 + fVar174 * fVar218;
            fVar133 = fVar115 * fVar119 + fVar94 * fVar117 + fVar180 * fVar221;
            fVar134 = fVar118 * fVar13 + fVar95 * fVar12 + fVar181 * fVar223;
            fVar81 = fVar120 * fVar82 + fVar100 * fVar81 + fVar182 * fVar225;
            fVar82 = fVar121 * fVar84 + fVar101 * fVar83 + fVar183 * fVar227;
            fVar83 = fVar122 * fVar14 + fVar102 * fVar85 + fVar184 * fVar229;
            fVar84 = fVar123 * fVar16 + fVar103 * fVar15 + fVar185 * fVar231;
            fVar85 = fVar124 + fVar124 + fVar137;
            fVar85 = fVar85 + fVar85;
            fVar107 = auVar88._0_4_;
            fVar106 = auVar88._4_4_;
            auVar54._4_4_ = auVar91._4_4_ * fVar106;
            auVar54._0_4_ = auVar91._0_4_ * fVar107;
            fVar114 = auVar88._8_4_;
            auVar54._8_4_ = auVar91._8_4_ * fVar114;
            fVar117 = auVar88._12_4_;
            auVar54._12_4_ = auVar91._12_4_ * fVar117;
            fVar119 = auVar88._16_4_;
            auVar54._16_4_ = auVar91._16_4_ * fVar119;
            fVar12 = auVar88._20_4_;
            auVar54._20_4_ = auVar91._20_4_ * fVar12;
            fVar13 = auVar88._24_4_;
            auVar54._24_4_ = auVar91._24_4_ * fVar13;
            auVar54._28_4_ = fVar124;
            auVar88 = vsubps_avx(auVar154,auVar54);
            uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
            auVar141._4_4_ = uVar3;
            auVar141._0_4_ = uVar3;
            auVar141._8_4_ = uVar3;
            auVar141._12_4_ = uVar3;
            auVar141._16_4_ = uVar3;
            auVar141._20_4_ = uVar3;
            auVar141._24_4_ = uVar3;
            auVar141._28_4_ = uVar3;
            local_12a0._4_4_ = (fVar133 + fVar133) * (fVar106 + fVar106 * auVar88._4_4_);
            local_12a0._0_4_ = (fVar132 + fVar132) * (fVar107 + fVar107 * auVar88._0_4_);
            local_12a0._8_4_ = (fVar134 + fVar134) * (fVar114 + fVar114 * auVar88._8_4_);
            local_12a0._12_4_ = (fVar81 + fVar81) * (fVar117 + fVar117 * auVar88._12_4_);
            local_12a0._16_4_ = (fVar82 + fVar82) * (fVar119 + fVar119 * auVar88._16_4_);
            local_12a0._20_4_ = (fVar83 + fVar83) * (fVar12 + fVar12 * auVar88._20_4_);
            local_12a0._24_4_ = (fVar84 + fVar84) * (fVar13 + fVar13 * auVar88._24_4_);
            local_12a0._28_4_ = fVar85;
            auVar88 = vcmpps_avx(auVar141,local_12a0,2);
            fVar107 = ray->tfar;
            auVar142._4_4_ = fVar107;
            auVar142._0_4_ = fVar107;
            auVar142._8_4_ = fVar107;
            auVar142._12_4_ = fVar107;
            auVar142._16_4_ = fVar107;
            auVar142._20_4_ = fVar107;
            auVar142._24_4_ = fVar107;
            auVar142._28_4_ = fVar107;
            auVar17 = vcmpps_avx(local_12a0,auVar142,2);
            auVar88 = vandps_avx(auVar17,auVar88);
            auVar17 = vcmpps_avx(auVar91,_DAT_01f7b000,4);
            auVar88 = vandps_avx(auVar88,auVar17);
            auVar73 = vpackssdw_avx(auVar88._0_16_,auVar88._16_16_);
            auVar74 = vpand_avx(auVar73,auVar74);
            auVar73 = vpmovsxwd_avx(auVar74);
            auVar125 = vpshufd_avx(auVar74,0xee);
            auVar125 = vpmovsxwd_avx(auVar125);
            local_1300._16_16_ = auVar125;
            local_1300._0_16_ = auVar73;
            if ((((((((local_1300 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_1300 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_1300 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_1300 >> 0x7f,0) == '\0') &&
                  (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB161(auVar125 >> 0x3f,0) == '\0') &&
                (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar125[0xf]) goto LAB_00e78528;
            local_1780 = ray;
            local_13c0 = local_14e0._0_4_;
            fStack_13bc = local_14e0._4_4_;
            fStack_13b8 = local_14e0._8_4_;
            fStack_13b4 = local_14e0._12_4_;
            fStack_13b0 = local_14e0._16_4_;
            fStack_13ac = local_14e0._20_4_;
            fStack_13a8 = local_14e0._24_4_;
            fStack_13a4 = local_14e0._28_4_;
            local_13a0 = local_1500._0_4_;
            fStack_139c = local_1500._4_4_;
            fStack_1398 = local_1500._8_4_;
            fStack_1394 = local_1500._12_4_;
            fStack_1390 = local_1500._16_4_;
            fStack_138c = local_1500._20_4_;
            fStack_1388 = local_1500._24_4_;
            fStack_1384 = local_1500._28_4_;
            local_1380 = local_1520;
            auVar88 = vrcpps_avx(local_1520);
            local_1220 = local_1560;
            fVar107 = auVar88._0_4_;
            fVar106 = auVar88._4_4_;
            auVar55._4_4_ = local_1520._4_4_ * fVar106;
            auVar55._0_4_ = local_1520._0_4_ * fVar107;
            fVar114 = auVar88._8_4_;
            auVar55._8_4_ = local_1520._8_4_ * fVar114;
            fVar117 = auVar88._12_4_;
            auVar55._12_4_ = local_1520._12_4_ * fVar117;
            fVar119 = auVar88._16_4_;
            auVar55._16_4_ = local_1520._16_4_ * fVar119;
            fVar12 = auVar88._20_4_;
            auVar55._20_4_ = local_1520._20_4_ * fVar12;
            fVar13 = auVar88._24_4_;
            auVar55._24_4_ = local_1520._24_4_ * fVar13;
            auVar55._28_4_ = fVar85;
            auVar17 = vsubps_avx(auVar154,auVar55);
            auVar80._0_4_ = fVar107 + fVar107 * auVar17._0_4_;
            auVar80._4_4_ = fVar106 + fVar106 * auVar17._4_4_;
            auVar80._8_4_ = fVar114 + fVar114 * auVar17._8_4_;
            auVar80._12_4_ = fVar117 + fVar117 * auVar17._12_4_;
            auVar80._16_4_ = fVar119 + fVar119 * auVar17._16_4_;
            auVar80._20_4_ = fVar12 + fVar12 * auVar17._20_4_;
            auVar80._24_4_ = fVar13 + fVar13 * auVar17._24_4_;
            auVar80._28_4_ = auVar88._28_4_ + auVar17._28_4_;
            auVar92._8_4_ = 0x219392ef;
            auVar92._0_8_ = 0x219392ef219392ef;
            auVar92._12_4_ = 0x219392ef;
            auVar92._16_4_ = 0x219392ef;
            auVar92._20_4_ = 0x219392ef;
            auVar92._24_4_ = 0x219392ef;
            auVar92._28_4_ = 0x219392ef;
            auVar17 = vcmpps_avx(local_1540,auVar92,5);
            auVar88 = vandps_avx(auVar17,auVar80);
            auVar56._4_4_ = local_14e0._4_4_ * auVar88._4_4_;
            auVar56._0_4_ = local_14e0._0_4_ * auVar88._0_4_;
            auVar56._8_4_ = local_14e0._8_4_ * auVar88._8_4_;
            auVar56._12_4_ = local_14e0._12_4_ * auVar88._12_4_;
            auVar56._16_4_ = local_14e0._16_4_ * auVar88._16_4_;
            auVar56._20_4_ = local_14e0._20_4_ * auVar88._20_4_;
            auVar56._24_4_ = local_14e0._24_4_ * auVar88._24_4_;
            auVar56._28_4_ = auVar17._28_4_;
            auVar17 = vminps_avx(auVar56,auVar154);
            auVar57._4_4_ = local_1500._4_4_ * auVar88._4_4_;
            auVar57._0_4_ = local_1500._0_4_ * auVar88._0_4_;
            auVar57._8_4_ = local_1500._8_4_ * auVar88._8_4_;
            auVar57._12_4_ = local_1500._12_4_ * auVar88._12_4_;
            auVar57._16_4_ = local_1500._16_4_ * auVar88._16_4_;
            auVar57._20_4_ = local_1500._20_4_ * auVar88._20_4_;
            auVar57._24_4_ = local_1500._24_4_ * auVar88._24_4_;
            auVar57._28_4_ = auVar88._28_4_;
            auVar18 = vminps_avx(auVar57,auVar154);
            auVar19 = vsubps_avx(auVar154,auVar17);
            auVar20 = vsubps_avx(auVar154,auVar18);
            auVar143._8_4_ = 0xbf800000;
            auVar143._0_8_ = 0xbf800000bf800000;
            auVar143._12_4_ = 0xbf800000;
            auVar143._16_4_ = 0xbf800000;
            auVar143._20_4_ = 0xbf800000;
            auVar143._24_4_ = 0xbf800000;
            auVar143._28_4_ = 0xbf800000;
            auVar88 = vblendvps_avx(auVar154,auVar143,local_1560);
            local_12c0 = vblendvps_avx(auVar18,auVar19,local_1560);
            local_12e0 = vblendvps_avx(auVar17,auVar20,local_1560);
            fVar107 = auVar88._0_4_;
            fVar106 = auVar88._4_4_;
            local_1280._4_4_ = fVar115 * fVar106;
            local_1280._0_4_ = fVar72 * fVar107;
            fVar114 = auVar88._8_4_;
            local_1280._8_4_ = fVar118 * fVar114;
            fVar117 = auVar88._12_4_;
            local_1280._12_4_ = fVar120 * fVar117;
            fVar119 = auVar88._16_4_;
            local_1280._16_4_ = fVar121 * fVar119;
            fVar12 = auVar88._20_4_;
            local_1280._20_4_ = fVar122 * fVar12;
            fVar13 = auVar88._24_4_;
            local_1280._24_4_ = fVar123 * fVar13;
            local_1280._28_4_ = local_12c0._28_4_;
            local_1260._4_4_ = fVar94 * fVar106;
            local_1260._0_4_ = fVar93 * fVar107;
            local_1260._8_4_ = fVar95 * fVar114;
            local_1260._12_4_ = fVar100 * fVar117;
            local_1260._16_4_ = fVar101 * fVar119;
            local_1260._20_4_ = fVar102 * fVar12;
            local_1260._24_4_ = fVar103 * fVar13;
            local_1260._28_4_ = local_12e0._28_4_;
            local_1240._4_4_ = fVar106 * fVar180;
            local_1240._0_4_ = fVar107 * fVar174;
            local_1240._8_4_ = fVar114 * fVar181;
            local_1240._12_4_ = fVar117 * fVar182;
            local_1240._16_4_ = fVar119 * fVar183;
            local_1240._20_4_ = fVar12 * fVar184;
            local_1240._24_4_ = fVar13 * fVar185;
            local_1240._28_4_ = auVar19._28_4_;
            auVar74 = vpsllw_avx(auVar74,0xf);
            auVar74 = vpacksswb_avx(auVar74,auVar74);
            uVar60 = (ulong)(byte)(SUB161(auVar74 >> 7,0) & 1 | (SUB161(auVar74 >> 0xf,0) & 1) << 1
                                   | (SUB161(auVar74 >> 0x17,0) & 1) << 2 |
                                   (SUB161(auVar74 >> 0x1f,0) & 1) << 3 |
                                   (SUB161(auVar74 >> 0x27,0) & 1) << 4 |
                                   (SUB161(auVar74 >> 0x2f,0) & 1) << 5 |
                                   (SUB161(auVar74 >> 0x37,0) & 1) << 6 |
                                  SUB161(auVar74 >> 0x3f,0) << 7);
            auVar191 = ZEXT3264(local_1580);
            auVar200 = ZEXT3264(local_15a0);
            auVar208 = ZEXT3264(local_15c0);
            auVar211 = ZEXT3264(local_15e0);
            auVar220 = ZEXT3264(local_1600);
            local_14c0 = auVar21;
            local_1480 = auVar89;
            do {
              uVar64 = 0;
              if (uVar60 != 0) {
                for (; (uVar60 >> uVar64 & 1) == 0; uVar64 = uVar64 + 1) {
                }
              }
              local_1708 = *(uint *)((long)&local_13e0 + uVar64 * 4);
              pGVar10 = (pSVar65->geometries).items[local_1708].ptr;
              if ((pGVar10->mask & *(uint *)((long)local_1780 + 0x24)) == 0) {
                uVar60 = uVar60 ^ 1L << (uVar64 & 0x3f);
              }
              else {
                local_1740._0_8_ = uVar64;
                pRVar67 = context->args;
                if ((pRVar67->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00e78578;
                local_1660._0_8_ = uVar60;
                local_1640._0_8_ = uVar68;
                local_1620 = SUB84(context,0);
                fStack_161c = (float)((ulong)context >> 0x20);
                local_16f0.context = context->user;
                local_1720 = *(undefined4 *)(local_1280 + uVar64 * 4);
                local_171c = *(undefined4 *)(local_1260 + uVar64 * 4);
                local_1718 = *(undefined4 *)(local_1240 + uVar64 * 4);
                local_1714 = *(undefined4 *)(local_12e0 + uVar64 * 4);
                local_1710 = *(undefined4 *)(local_12c0 + uVar64 * 4);
                local_170c = *(undefined4 *)((long)&local_1400 + uVar64 * 4);
                local_1704 = (local_16f0.context)->instID[0];
                local_1700 = (local_16f0.context)->instPrimID[0];
                local_1680._0_4_ = *(undefined4 *)((long)local_1780 + 0x20);
                *(undefined4 *)((long)local_1780 + 0x20) = *(undefined4 *)(local_12a0 + uVar64 * 4);
                local_1794 = -1;
                local_16f0.valid = &local_1794;
                local_16f0.geometryUserPtr = pGVar10->userPtr;
                local_16f0.ray = (RTCRayN *)local_1780;
                local_16f0.hit = (RTCHitN *)&local_1720;
                local_16f0.N = 1;
                local_16a0._0_8_ = pGVar10;
                if (pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00e78458:
                  if ((pRVar67->filter == (RTCFilterFunctionN)0x0) ||
                     (((pRVar67->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                       RTC_RAY_QUERY_FLAG_INCOHERENT &&
                      ((*(byte *)(local_16a0._0_8_ + 0x3e) & 0x40) == 0)))) {
LAB_00e78578:
                    *(undefined4 *)((long)local_1780 + 0x20) = 0xff800000;
                    return;
                  }
                  (*pRVar67->filter)(&local_16f0);
                  if (*local_16f0.valid != 0) goto LAB_00e78578;
                }
                else {
                  local_16c0._0_8_ = pRVar67;
                  (*pGVar10->occlusionFilterN)(&local_16f0);
                  pRVar67 = (RTCIntersectArguments *)local_16c0._0_8_;
                  if (*local_16f0.valid != 0) goto LAB_00e78458;
                }
                *(undefined4 *)((long)local_1780 + 0x20) = local_1680._0_4_;
                uVar60 = local_1660._0_8_ ^ 1L << (local_1740._0_8_ & 0x3f);
                context = (RayQueryContext *)CONCAT44(fStack_161c,local_1620);
                auVar191 = ZEXT3264(local_1580);
                auVar200 = ZEXT3264(local_15a0);
                auVar208 = ZEXT3264(local_15c0);
                auVar211 = ZEXT3264(local_15e0);
                auVar220 = ZEXT3264(local_1600);
                pSVar65 = local_1788;
                uVar68 = local_1640._0_8_;
              }
            } while (uVar60 != 0);
            ray = local_1780;
          }
        }
        goto LAB_00e77965;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }